

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::_q_updateSortCache(QGraphicsSceneBspTreeIndexPrivate *this)

{
  long *plVar1;
  parameter_type t;
  iterator __first;
  iterator __last;
  int i;
  undefined1 *puVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  QArrayDataPointer<QGraphicsItem_*> local_38;
  int stackingOrder;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QGraphicsSceneIndexPrivate).field_0x8;
  _q_updateIndex(this);
  if ((this->sortCacheEnabled == true) && (this->updatingSortCache == true)) {
    this->updatingSortCache = false;
    stackingOrder = 0;
    local_38.size = 0;
    local_38.d = (Data *)0x0;
    local_38.ptr = (QGraphicsItem **)0x0;
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d._0_4_ = 0xaaaaaaaa;
    local_58.d._4_4_ = 0xaaaaaaaa;
    local_58.ptr._0_4_ = 0xaaaaaaaa;
    local_58.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*plVar1 + 0x60))(&local_58,plVar1,1);
    for (puVar2 = (undefined1 *)0x0; puVar2 < (ulong)local_58.size; puVar2 = puVar2 + 1) {
      t = *(parameter_type *)(CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + (long)puVar2 * 8);
      if ((t != (parameter_type)0x0) && (((t->d_ptr).d)->parent == (QGraphicsItem *)0x0)) {
        QList<QGraphicsItem_*>::append((QList<QGraphicsItem_*> *)&local_38,t);
      }
    }
    __first = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)&local_38);
    __last = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)&local_38);
    std::
    __sort<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
              (__first,__last,
               (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5837c1);
    for (uVar3 = 0; uVar3 < (ulong)local_38.size; uVar3 = uVar3 + 1) {
      climbTree(local_38.ptr[uVar3],&stackingOrder);
    }
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::_q_updateSortCache()
{
    Q_Q(QGraphicsSceneBspTreeIndex);
    _q_updateIndex();

    if (!sortCacheEnabled || !updatingSortCache)
        return;

    updatingSortCache = false;
    int stackingOrder = 0;

    QList<QGraphicsItem *> topLevels;
    const QList<QGraphicsItem *> items = q->items();
    for (int i = 0; i < items.size(); ++i) {
        QGraphicsItem *item = items.at(i);
        if (item && !item->d_ptr->parent)
            topLevels << item;
    }

    std::sort(topLevels.begin(), topLevels.end(), qt_closestLeaf);
    for (int i = 0; i < topLevels.size(); ++i)
        climbTree(topLevels.at(i), &stackingOrder);
}